

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

bool __thiscall LinearSystem::RunDirectGauss(LinearSystem *this,ChoiceType choice_type)

{
  int iVar1;
  int lhs;
  bool bVar2;
  int *piVar3;
  Fraction *pFVar4;
  Fraction FVar5;
  Fraction *b;
  Fraction local_34;
  Fraction coefficient;
  int row;
  int local_1c;
  int pos;
  int max_pos;
  ChoiceType choice_type_local;
  LinearSystem *this_local;
  
  this->rank_ = 0;
  piVar3 = std::min<int>(&this->n_,&this->m_);
  iVar1 = *piVar3;
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    bVar2 = Choice(this,local_1c,choice_type);
    if ((bVar2) || (bVar2 = Choice(this,local_1c,Column), bVar2)) {
      this->rank_ = this->rank_ + 1;
      coefficient.denominator_ = 1;
      pFVar4 = ExtendedMatrix::At(&this->system_,local_1c,local_1c);
      FVar5 = operator/(&coefficient.denominator_,pFVar4);
      PerformOperation(this,MultiplyRow,local_1c,0,FVar5);
      AddMainOutput(this);
      coefficient.numerator_ = local_1c;
      while (coefficient.numerator_ = coefficient.numerator_ + 1, coefficient.numerator_ < this->n_)
      {
        pFVar4 = ExtendedMatrix::At(&this->system_,coefficient.numerator_,local_1c);
        b = ExtendedMatrix::At(&this->system_,local_1c,local_1c);
        local_34 = operator/(pFVar4,b);
        lhs = coefficient.numerator_;
        FVar5 = Fraction::operator-(&local_34);
        PerformOperation(this,AddRow,lhs,local_1c,FVar5);
      }
      AddMainOutput(this);
    }
  }
  this->rank_ = this->n_;
  return this->n_ != 0;
}

Assistant:

bool LinearSystem::RunDirectGauss(Options::ChoiceType choice_type) {
  rank_ = 0;

  int max_pos = std::min(n_, m_);
  for (int pos = 0; pos < max_pos; ++pos) {
    if (!Choice(pos, choice_type) && !Choice(pos)) {
      continue;
    }

    ++rank_;

    PerformOperation(OperationType::MultiplyRow, pos, 0, 1 / system_.At(pos, pos));
    AddMainOutput();

    for (int row = pos + 1; row < n_; ++row) {
      Fraction coefficient = system_.At(row, pos) / system_.At(pos, pos);
      PerformOperation(OperationType::AddRow, row, pos, -coefficient);
    }

    AddMainOutput();
  }

  return rank_ = n_;
}